

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob~.c
# Opt level: O2

void bob_dsp(t_bob *x,t_signal **sp)

{
  t_signal *ptVar1;
  
  ptVar1 = *sp;
  x->x_sr = (double)ptVar1->s_sr;
  dsp_add(bob_perform,6,x,ptVar1->s_vec,sp[1]->s_vec,sp[2]->s_vec,sp[3]->s_vec,(long)ptVar1->s_n);
  return;
}

Assistant:

static void bob_dsp(t_bob *x, t_signal **sp)
{
    x->x_sr = sp[0]->s_sr;
    dsp_add(bob_perform, 6, x, sp[0]->s_vec, sp[1]->s_vec,
        sp[2]->s_vec, sp[3]->s_vec, (t_int)sp[0]->s_n);
}